

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

ly_bool lyd_node_should_print(lyd_node *node,uint32_t options)

{
  ly_bool lVar1;
  lyd_node_inner *local_48;
  lyd_node *LYD_TREE_DFS_next_1;
  lyd_node_inner *plStack_38;
  ly_bool LYD_TREE_DFS_continue_1;
  lyd_node *LYD_TREE_DFS_next;
  lyd_node_inner *plStack_28;
  ly_bool LYD_TREE_DFS_continue;
  lyd_node *elem;
  uint32_t options_local;
  lyd_node *node_local;
  
  if ((options & 0x10) == 0) {
    plStack_28 = (lyd_node_inner *)node;
    if (((node->flags & 1) != 0) && (node->schema->nodetype == 1)) {
      if ((options & 4) != 0) {
        return '\x01';
      }
      while( true ) {
        if (plStack_28 == (lyd_node_inner *)0x0) {
          return '\0';
        }
        if ((plStack_28 != (lyd_node_inner *)node) &&
           (lVar1 = lyd_node_should_print((lyd_node *)plStack_28,options), lVar1 != '\0')) break;
        if (((plStack_28->field_0).node.flags & 1) == 0) {
          __assert_fail("elem->flags & LYD_DEFAULT",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c"
                        ,0x54,"ly_bool lyd_node_should_print(const struct lyd_node *, uint32_t)");
        }
        plStack_38 = (lyd_node_inner *)lyd_child((lyd_node *)plStack_28);
        if (plStack_38 == (lyd_node_inner *)0x0) {
          if (plStack_28 == (lyd_node_inner *)node) {
            return '\0';
          }
          plStack_38 = (lyd_node_inner *)(plStack_28->field_0).node.next;
        }
        while ((plStack_38 == (lyd_node_inner *)0x0 &&
               (plStack_28 = (plStack_28->field_0).node.parent,
               (plStack_28->field_0).node.parent != node->parent))) {
          plStack_38 = (lyd_node_inner *)(plStack_28->field_0).node.next;
        }
        plStack_28 = plStack_38;
      }
      return '\x01';
    }
    if ((((node->flags & 1) != 0) && ((options & 0xf0) == 0)) && ((node->schema->flags & 2) == 0)) {
      if (((node->schema->flags & 0x7000) == 0) && ((node->schema->flags & 1) != 0)) {
        while (plStack_28 != (lyd_node_inner *)0x0) {
          if (((((plStack_28->field_0).node.schema)->nodetype != 1) ||
              ((((plStack_28->field_0).node.schema)->flags & 0x80) != 0)) &&
             ((((plStack_28->field_0).node.schema)->flags & 2) != 0)) {
            return '\x01';
          }
          local_48 = (lyd_node_inner *)lyd_child((lyd_node *)plStack_28);
          if (local_48 == (lyd_node_inner *)0x0) {
            if (plStack_28 == (lyd_node_inner *)node) {
              return '\0';
            }
            local_48 = (lyd_node_inner *)(plStack_28->field_0).node.next;
          }
          while ((local_48 == (lyd_node_inner *)0x0 &&
                 (plStack_28 = (plStack_28->field_0).node.parent,
                 (plStack_28->field_0).node.parent != node->parent))) {
            local_48 = (lyd_node_inner *)(plStack_28->field_0).node.next;
          }
          plStack_28 = local_48;
        }
      }
      return '\0';
    }
  }
  else {
    if ((node->flags & 1) != 0) {
      return '\0';
    }
    if ((node->schema == (lysc_node *)0x0) || ((node->schema->nodetype & 0xc) == 0)) {
      if ((node->schema != (lysc_node *)0x0) &&
         ((node->schema->nodetype == 1 && ((node->schema->flags & 0x80) == 0)))) {
        if ((options & 4) != 0) {
          return '\x01';
        }
        plStack_28 = (lyd_node_inner *)lyd_child(node);
        while( true ) {
          if (plStack_28 == (lyd_node_inner *)0x0) {
            return '\0';
          }
          lVar1 = lyd_node_should_print((lyd_node *)plStack_28,options);
          if (lVar1 != '\0') break;
          plStack_28 = (lyd_node_inner *)((lyd_node *)plStack_28)->next;
        }
        return '\x01';
      }
    }
    else {
      lVar1 = lyd_is_default(node);
      if (lVar1 != '\0') {
        return '\0';
      }
    }
  }
  return '\x01';
}

Assistant:

LIBYANG_API_DEF ly_bool
lyd_node_should_print(const struct lyd_node *node, uint32_t options)
{
    const struct lyd_node *elem;

    if (options & LYD_PRINT_WD_TRIM) {
        /* do not print default nodes */
        if (node->flags & LYD_DEFAULT) {
            /* implicit default node/NP container with only default nodes */
            return 0;
        } else if (node->schema && (node->schema->nodetype & LYD_NODE_TERM)) {
            if (lyd_is_default(node)) {
                /* explicit default node */
                return 0;
            }
        } else if (lysc_is_np_cont(node->schema)) {
            if (options & LYD_PRINT_KEEPEMPTYCONT) {
                /* explicit request to print, redundant to check */
                return 1;
            }

            LY_LIST_FOR(lyd_child(node), elem) {
                if (lyd_node_should_print(elem, options)) {
                    return 1;
                }
            }

            /* NP container without any printed children (such as other NP containers with only nodes set to their default values) */
            return 0;
        }
    } else if ((node->flags & LYD_DEFAULT) && (node->schema->nodetype == LYS_CONTAINER)) {
        if (options & LYD_PRINT_KEEPEMPTYCONT) {
            /* explicit request to print */
            return 1;
        }

        /* avoid empty default containers */
        LYD_TREE_DFS_BEGIN(node, elem) {
            if ((elem != node) && lyd_node_should_print(elem, options)) {
                return 1;
            }
            assert(elem->flags & LYD_DEFAULT);
            LYD_TREE_DFS_END(node, elem)
        }
        return 0;
    } else if ((node->flags & LYD_DEFAULT) && !(options & LYD_PRINT_WD_MASK) && !(node->schema->flags & LYS_CONFIG_R)) {
        /* LYD_PRINT_WD_EXPLICIT, find out if this is some input/output */
        if (!(node->schema->flags & (LYS_IS_INPUT | LYS_IS_OUTPUT | LYS_IS_NOTIF)) && (node->schema->flags & LYS_CONFIG_W)) {
            /* print only if it contains status data in its subtree */
            LYD_TREE_DFS_BEGIN(node, elem) {
                if ((elem->schema->nodetype != LYS_CONTAINER) || (elem->schema->flags & LYS_PRESENCE)) {
                    if (elem->schema->flags & LYS_CONFIG_R) {
                        return 1;
                    }
                }
                LYD_TREE_DFS_END(node, elem)
            }
        }
        return 0;
    }

    return 1;
}